

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::RangeDynamicLayerParams::RangeDynamicLayerParams
          (RangeDynamicLayerParams *this,RangeDynamicLayerParams *from)

{
  void *pvVar1;
  float fVar2;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__RangeDynamicLayerParams_00705438
  ;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  fVar2 = from->stepsizevalue_;
  this->startvalue_ = from->startvalue_;
  this->stepsizevalue_ = fVar2;
  return;
}

Assistant:

RangeDynamicLayerParams::RangeDynamicLayerParams(const RangeDynamicLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&startvalue_, &from.startvalue_,
    reinterpret_cast<char*>(&stepsizevalue_) -
    reinterpret_cast<char*>(&startvalue_) + sizeof(stepsizevalue_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.RangeDynamicLayerParams)
}